

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::GetEnumFileName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          EnumDescriptor *desc,bool with_package)

{
  ulong *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar4;
  string *extraout_RAX_01;
  size_type *psVar5;
  pointer pcVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined7 in_register_00000081;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_130;
  long local_128;
  ulong local_120;
  undefined8 uStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100;
  undefined8 uStack_f8;
  undefined1 local_f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  pointer local_c0 [2];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_d0._M_allocated_capacity = (size_type)local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,*(long *)this,*(long *)(this + 8) + *(long *)this,desc,
             CONCAT71(in_register_00000081,with_package));
  std::__cxx11::string::append(local_d0._M_local_buf);
  if ((char)desc == '\0') {
    local_f0._0_8_ = local_f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"");
  }
  else {
    GetNamespace_abi_cxx11_
              (&local_50,*(_anonymous_namespace_ **)(this + 0x20),
               *(GeneratorOptions **)(this + 0x28),
               (FileDescriptor *)(options->output_dir).field_2._M_allocated_capacity);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    psVar5 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_70.field_2._M_allocated_capacity = *psVar5;
      local_70.field_2._8_8_ = plVar2[3];
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar5;
      local_70._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_70._M_string_length = plVar2[1];
    *plVar2 = (long)psVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    anon_unknown_0::ToLower((string *)local_f0,&local_70);
  }
  pcVar6 = (pointer)0xf;
  if ((pointer *)local_d0._M_allocated_capacity != local_c0) {
    pcVar6 = local_c0[0];
  }
  if (pcVar6 < (pointer)(local_f0._8_8_ + local_d0._8_8_)) {
    pcVar6 = (pointer)0xf;
    if ((string *)local_f0._0_8_ != (string *)(local_f0 + 0x10)) {
      pcVar6 = (pointer)local_f0._16_8_;
    }
    if (pcVar6 < (pointer)(local_f0._8_8_ + local_d0._8_8_)) goto LAB_0025fd36;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)local_f0,0,(char *)0x0,local_d0._M_allocated_capacity);
  }
  else {
LAB_0025fd36:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append(local_d0._M_local_buf,local_f0._0_8_);
  }
  local_130 = &local_120;
  puVar1 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar1) {
    local_120 = *puVar1;
    uStack_118 = puVar3[3];
  }
  else {
    local_120 = *puVar1;
    local_130 = (ulong *)*puVar3;
  }
  local_128 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  anon_unknown_0::ToLower(&local_90,(string *)(options->output_dir)._M_string_length);
  uVar7 = 0xf;
  if (local_130 != &local_120) {
    uVar7 = local_120;
  }
  if (uVar7 < local_90._M_string_length + local_128) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar8 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_90._M_string_length + local_128) goto LAB_0025fdff;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_130);
  }
  else {
LAB_0025fdff:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_90._M_dataplus._M_p);
  }
  local_110 = &local_100;
  puVar1 = puVar3 + 2;
  if ((ulong *)*puVar3 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar3[3];
  }
  else {
    local_100 = *puVar1;
    local_110 = (ulong *)*puVar3;
  }
  local_108 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  GeneratorOptions::GetFileNameExtension_abi_cxx11_(&local_b0,(GeneratorOptions *)this);
  uVar7 = 0xf;
  if (local_110 != &local_100) {
    uVar7 = local_100;
  }
  if (uVar7 < local_b0._M_string_length + local_108) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar8 = local_b0.field_2._M_allocated_capacity;
    }
    if (local_b0._M_string_length + local_108 <= (ulong)uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_110);
      goto LAB_0025fee4;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_b0._M_dataplus._M_p);
LAB_0025fee4:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar5) {
    uVar8 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar5;
  puVar3[1] = 0;
  *(undefined1 *)psVar5 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  psVar4 = (string *)(local_f0 + 0x10);
  if ((string *)local_f0._0_8_ != psVar4) {
    operator_delete((void *)local_f0._0_8_);
    psVar4 = extraout_RAX;
  }
  if ((char)desc != '\0') {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    psVar4 = (string *)&local_50.field_2;
    if ((string *)local_50._M_dataplus._M_p != psVar4) {
      operator_delete(local_50._M_dataplus._M_p);
      psVar4 = extraout_RAX_00;
    }
  }
  if ((pointer *)local_d0._M_allocated_capacity != local_c0) {
    operator_delete((void *)local_d0._M_allocated_capacity);
    psVar4 = extraout_RAX_01;
  }
  return psVar4;
}

Assistant:

std::string GetEnumFileName(const GeneratorOptions& options,
                            const EnumDescriptor* desc, bool with_package) {
  return options.output_dir + "/" +
         (with_package ? ToLower(GetNamespace(options, desc->file()) + "_")
                       : "") +
         ToLower(desc->name()) + options.GetFileNameExtension();
}